

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

void strings(void)

{
  l[1].type = 's';
  l[0].type = 's';
  l[0].val.d = anon_var_dwarf_4d9;
  l[1].val.d = (long)"rtosc rtosc rtosc" + 0xc;
  r[0].val.d = anon_var_dwarf_4f9;
  r[1].val.d = (long)"cmp1(%c, %c)\n" + 0xd;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"one string","another string",0xb7);
  cmp_gt(l,l + 1,1,1,(rtosc_cmp_options *)0x0,"one string","subset string",0xb8);
  cmp_gt(r,r + 1,1,1,(rtosc_cmp_options *)0x0,"normal string","empty string",0xb9);
  return;
}

Assistant:

void strings()
{
    l[0].type = l[1].type = 's';

    l[0].val.s = "rtosc rtosc rtosc";
    l[1].val.s = "rtosc";
    r[0].val.s = "rt0sc";
    r[1].val.s = "";

    cmp_gt(l, r, 1, 1, NULL, "one string", "another string", __LINE__);
    cmp_gt(l, l+1, 1, 1, NULL, "one string", "subset string", __LINE__);
    cmp_gt(r, r+1, 1, 1, NULL, "normal string", "empty string", __LINE__);
}